

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O2

void __thiscall gui::Panel::Panel(Panel *this,shared_ptr<gui::PanelStyle> *style,String *name)

{
  Group::Group(&this->super_Group,name);
  (this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase =
       (_func_int **)&PTR__Panel_001dcc10;
  (this->super_Group).super_Container.super_Widget.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__Panel_001dcc90;
  std::__shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->style_).super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>,
             &style->super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>);
  this->styleCopied_ = false;
  (this->size_).x = 0.0;
  (this->size_).y = 0.0;
  return;
}

Assistant:

Panel::Panel(std::shared_ptr<PanelStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false) {
}